

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secret_manager.cpp
# Opt level: O2

string * __thiscall
duckdb::SecretManager::DefaultStorage_abi_cxx11_(string *__return_storage_ptr__,SecretManager *this)

{
  ::std::__cxx11::string::string
            ((string *)__return_storage_ptr__,(string *)&(this->config).default_persistent_storage);
  return __return_storage_ptr__;
}

Assistant:

string SecretManager::DefaultStorage() {
	return config.default_persistent_storage;
}